

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

FILE * file_open(lemon *lemp,char *suffix,char *mode)

{
  char *__filename;
  FILE *pFVar1;
  
  if (lemp->outname != (char *)0x0) {
    free(lemp->outname);
  }
  __filename = file_makename(lemp,suffix);
  lemp->outname = __filename;
  pFVar1 = fopen(__filename,mode);
  if ((pFVar1 == (FILE *)0x0) && (*mode == 'w')) {
    file_open_cold_1();
    pFVar1 = (FILE *)0x0;
  }
  return (FILE *)pFVar1;
}

Assistant:

PRIVATE FILE *file_open(
  struct lemon *lemp,
  const char *suffix,
  const char *mode
){
  FILE *fp;

  if( lemp->outname ) free(lemp->outname);
  lemp->outname = file_makename(lemp, suffix);
  fp = fopen(lemp->outname,mode);
  if( fp==0 && *mode=='w' ){
    fprintf(stderr,"Can't open file \"%s\".\n",lemp->outname);
    lemp->errorcnt++;
    return 0;
  }
  return fp;
}